

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

void __thiscall QTextDocumentPrivate::clear(QTextDocumentPrivate *this)

{
  QMap<int,_QTextObject_*> *this_00;
  FragmentMap *this_01;
  BlockMap *this_02;
  bool bVar1;
  uint uVar2;
  QTextDocument *this_03;
  Span *pSVar3;
  long lVar4;
  QTextFrame *pQVar5;
  QArrayData *pQVar6;
  Header *pHVar7;
  Header *pHVar8;
  QTextBlockData *pQVar9;
  QTextLayout *this_04;
  QAbstractTextDocumentLayout *pQVar10;
  ulong uVar11;
  int _t2;
  uint n;
  uint uVar12;
  QMapData<std::map<int,_QTextObject_*,_std::less<int>,_std::allocator<std::pair<const_int,_QTextObject_*>_>_>_>
  *pQVar13;
  const_iterator alast;
  const_iterator afirst;
  EVP_PKEY_CTX *ctx;
  Data *pDVar14;
  EVP_PKEY_CTX *pEVar15;
  ulong uVar16;
  long in_FS_OFFSET;
  QHash<QTextCursorPrivate_*,_QHashDummyValue> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_03 = *(QTextDocument **)&this->field_0x8;
  local_40.d = (this->cursors).q_hash.d;
  if (local_40.d == (Data *)0x0) {
LAB_004d01d8:
    uVar16 = 0;
    pDVar14 = (Data *)0x0;
LAB_004d01da:
    if (uVar16 == 0 && pDVar14 == (Data *)0x0) goto LAB_004d0278;
  }
  else {
    pDVar14 = local_40.d;
    if ((local_40.d)->spans->offsets[0] == 0xff) {
      uVar11 = 1;
      do {
        uVar16 = uVar11;
        if ((local_40.d)->numBuckets == uVar16) goto LAB_004d01d8;
        uVar11 = uVar16 + 1;
      } while ((local_40.d)->spans[uVar16 >> 7].offsets[(uint)uVar16 & 0x7f] == 0xff);
      goto LAB_004d01da;
    }
    uVar16 = 0;
  }
  do {
    pSVar3 = pDVar14->spans;
    lVar4 = *(long *)pSVar3[uVar16 >> 7].entries[pSVar3[uVar16 >> 7].offsets[(uint)uVar16 & 0x7f]].
                     storage.data;
    if (*(int *)(lVar4 + 0x18) != 0) {
      *(undefined4 *)(lVar4 + 0x18) = 0;
    }
    *(undefined4 *)(lVar4 + 0x24) = 0xffffffff;
    *(undefined8 *)(lVar4 + 0x1c) = 0;
    do {
      if (pDVar14->numBuckets - 1 == uVar16) {
        uVar16 = 0;
        pDVar14 = (Data *)0x0;
        break;
      }
      uVar16 = uVar16 + 1;
    } while (pSVar3[uVar16 >> 7].offsets[(uint)uVar16 & 0x7f] == 0xff);
  } while ((uVar16 != 0) || (pDVar14 != (Data *)0x0));
LAB_004d0278:
  if ((local_40.d != (Data *)0x0) &&
     (((local_40.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((local_40.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QHash<QTextCursorPrivate_*,_QHashDummyValue>::clear(&(this->cursors).q_hash);
  this_00 = &this->objects;
  QMap<int,_QTextObject_*>::detach(this_00);
  afirst._M_node =
       (((this->objects).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  QMap<int,_QTextObject_*>::detach(this_00);
  pQVar13 = (this->objects).d.d.ptr;
  while ((_Rb_tree_header *)afirst._M_node != &(pQVar13->m)._M_t._M_impl.super__Rb_tree_header) {
    pQVar5 = *(QTextFrame **)((long)afirst._M_node + 0x28);
    if (pQVar5 == this->rtFrame) {
      afirst._M_node = (_Base_ptr)std::_Rb_tree_increment(afirst._M_node);
    }
    else {
      if (pQVar5 != (QTextFrame *)0x0) {
        (**(code **)(*(long *)&pQVar5->super_QTextObject + 0x20))();
      }
      alast.i._M_node = (const_iterator)std::_Rb_tree_increment(afirst._M_node);
      afirst._M_node = (_Base_ptr)QMap<int,_QTextObject_*>::erase(this_00,afirst._M_node,alast);
    }
    QMap<int,_QTextObject_*>::detach(this_00);
    pQVar13 = (this_00->d).d.ptr;
  }
  QMap<int,_QTextObject_*>::clear(this_00);
  if ((this->title).d.ptr != (char16_t *)0x0) {
    pQVar6 = &((this->title).d.d)->super_QArrayData;
    (this->title).d.d = (Data *)0x0;
    (this->title).d.ptr = (char16_t *)0x0;
    (this->title).d.size = 0;
    if (pQVar6 != (QArrayData *)0x0) {
      LOCK();
      (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar6,2,0x10);
      }
    }
  }
  clearUndoRedoStacks(this,UndoAndRedoStacks,false);
  pQVar6 = &((this->text).d.d)->super_QArrayData;
  (this->text).d.d = (Data *)0x0;
  (this->text).d.ptr = (char16_t *)0x0;
  (this->text).d.size = 0;
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar6,2,0x10);
    }
  }
  this->unreachableCharacterCount = 0;
  this->modifiedState = 0;
  this->modified = false;
  QTextFormatCollection::clear(&this->formats);
  this_01 = &this->fragments;
  ctx = (EVP_PKEY_CTX *)0x0;
  _t2 = QFragmentMapData<QTextFragmentData>::length(&this_01->data,0);
  pHVar7 = (this->fragments).data.field_0.head;
  uVar2 = pHVar7->root;
  do {
    n = uVar2;
    if (n == 0) goto LAB_004d0404;
    uVar2 = *(uint *)((long)pHVar7 + (ulong)n * 0x20 + 4);
  } while (uVar2 != 0);
  do {
    ctx = (EVP_PKEY_CTX *)(ulong)n;
    n = QFragmentMapData<QTextFragmentData>::next(&this_01->data,n);
  } while (n != 0);
LAB_004d0404:
  QFragmentMapData<QTextFragmentData>::init(&this_01->data,ctx);
  this_02 = &this->blocks;
  pHVar8 = (this->blocks).data.field_0.head;
  uVar2 = pHVar8->root;
  do {
    pEVar15 = (EVP_PKEY_CTX *)(ulong)uVar2;
    if (uVar2 == 0) goto LAB_004d0490;
    uVar2 = *(uint *)((long)pHVar8 + (long)pEVar15 * 0x48 + 4);
  } while (uVar2 != 0);
  do {
    ctx = pEVar15;
    pQVar9 = (this_02->data).field_0.fragments;
    this_04 = pQVar9[(long)ctx].layout;
    if (this_04 != (QTextLayout *)0x0) {
      QTextLayout::~QTextLayout(this_04);
    }
    operator_delete(this_04,8);
    pQVar9[(long)ctx].layout = (QTextLayout *)0x0;
    if (pQVar9[(long)ctx].userData != (QTextBlockUserData *)0x0) {
      (*(pQVar9[(long)ctx].userData)->_vptr_QTextBlockUserData[1])();
    }
    pQVar9[(long)ctx].userData = (QTextBlockUserData *)0x0;
    uVar12 = QFragmentMapData<QTextBlockData>::next(&this_02->data,(uint)ctx);
    pEVar15 = (EVP_PKEY_CTX *)(ulong)uVar12;
  } while (uVar12 != 0);
LAB_004d0490:
  QFragmentMapData<QTextBlockData>::init(&this_02->data,ctx);
  QMap<QUrl,_QVariant>::clear(&this->cachedResources);
  if (this->rtFrame != (QTextFrame *)0x0) {
    (**(code **)(*(long *)&this->rtFrame->super_QTextObject + 0x20))();
  }
  this->rtFrame = (QTextFrame *)0x0;
  init(this,ctx);
  QHash<QTextCursorPrivate_*,_QHashDummyValue>::operator=(&(this->cursors).q_hash,&local_40);
  bVar1 = this->inContentsChange;
  this->inContentsChange = true;
  QTextDocument::contentsChange(this_03,0,_t2,0);
  this->inContentsChange = bVar1;
  pQVar10 = this->lout;
  if (pQVar10 != (QAbstractTextDocumentLayout *)0x0) {
    (**(code **)(*(long *)pQVar10 + 0x90))(pQVar10,0,_t2,0);
  }
  QHash<QTextCursorPrivate_*,_QHashDummyValue>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentPrivate::clear()
{
    Q_Q(QTextDocument);

    for (QTextCursorPrivate *curs : std::as_const(cursors)) {
        curs->setPosition(0);
        curs->currentCharFormat = -1;
        curs->anchor = 0;
        curs->adjusted_anchor = 0;
    }

    QSet<QTextCursorPrivate *> oldCursors = cursors;
    QT_TRY{
        cursors.clear();

        QMap<int, QTextObject *>::Iterator objectIt = objects.begin();
        while (objectIt != objects.end()) {
            if (*objectIt != rtFrame) {
                delete *objectIt;
                objectIt = objects.erase(objectIt);
            } else {
                ++objectIt;
            }
        }
        // also clear out the remaining root frame pointer
        // (we're going to delete the object further down)
        objects.clear();

        title.clear();
        clearUndoRedoStacks(QTextDocument::UndoAndRedoStacks);
        text = QString();
        unreachableCharacterCount = 0;
        modifiedState = 0;
        modified = false;
        formats.clear();
        int len = fragments.length();
        fragments.clear();
        blocks.clear();
        cachedResources.clear();
        delete rtFrame;
        rtFrame = nullptr;
        init();
        cursors = oldCursors;
        {
            QScopedValueRollback<bool> bg(inContentsChange, true);
            emit q->contentsChange(0, len, 0);
        }
        if (lout)
            lout->documentChanged(0, len, 0);
    }